

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03_signal_epoll.c
# Opt level: O1

int setup_listening_socket(int port)

{
  uint __fd;
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  ssize_t sVar3;
  size_t __n;
  int *piVar4;
  long lVar5;
  ulong unaff_RBX;
  epoll_data_t *peVar6;
  sockaddr *__addr;
  char **argv;
  int iVar7;
  char *pcVar8;
  int enable;
  sockaddr_in srv_addr;
  _union_1457 _Stack_4f8;
  sigset_t sStack_4f0;
  undefined4 uStack_470;
  ulong uStack_460;
  code *pcStack_458;
  char acStack_450 [1024];
  ulong uStack_50;
  undefined4 local_2c;
  sockaddr local_28;
  
  uVar2 = 2;
  __addr = (sockaddr *)0x1;
  __fd = socket(2,1,0);
  if (__fd == 0xffffffff) {
    setup_listening_socket_cold_4();
LAB_001013db:
    setup_listening_socket_cold_3();
LAB_001013e0:
    setup_listening_socket_cold_2();
  }
  else {
    unaff_RBX = (ulong)__fd;
    local_2c = 1;
    __addr = (sockaddr *)0x1;
    uVar2 = __fd;
    iVar1 = setsockopt(__fd,1,2,&local_2c,4);
    if (iVar1 < 0) goto LAB_001013db;
    __addr = &local_28;
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    local_28.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
    local_28.sa_family = 2;
    local_28.sa_data._2_4_ = 0;
    uVar2 = __fd;
    iVar1 = bind(__fd,__addr,0x10);
    if (iVar1 < 0) goto LAB_001013e0;
    __addr = (sockaddr *)0xa;
    uVar2 = __fd;
    iVar1 = listen(__fd,10);
    if (-1 < iVar1) {
      return __fd;
    }
  }
  setup_listening_socket_cold_1();
  pcVar8 = acStack_450;
  pcStack_458 = (code *)0x10140b;
  uStack_50 = unaff_RBX;
  memset(acStack_450,0,0x400);
  pcStack_458 = (code *)0x10141a;
  sVar3 = read(uVar2,acStack_450,0x3ff);
  iVar1 = (int)sVar3;
  if (iVar1 != 0) {
    if (iVar1 == -1) {
      pcStack_458 = setup_signals;
      copy_fd_cold_1();
      uStack_460 = (ulong)__addr & 0xffffffff;
      pcStack_458 = (code *)acStack_450;
      if (1 < (int)uVar2) {
        pcStack_458 = (code *)acStack_450;
        piVar4 = __errno_location();
        *piVar4 = 0;
        lVar5 = strtol(*(char **)(pcVar8 + 8),(char **)0x0,10);
        if (*piVar4 == 0) {
          if (lVar5 == 0) goto LAB_001014e8;
          printf("Alarm after %ld seconds.\n",lVar5);
          sigemptyset(&sStack_4f0);
          uStack_470 = 0x10000000;
          _Stack_4f8.sa_handler = sigalrm_handler;
          iVar1 = sigaction(0xe,(sigaction *)&_Stack_4f8,(sigaction *)0x0);
          if (iVar1 != -1) {
            uVar2 = alarm((uint)lVar5);
            return uVar2;
          }
        }
        else {
          setup_signals_cold_1();
        }
        setup_signals_cold_2();
        iVar1 = 0;
        epollfd = epoll_create1(0);
        if (epollfd != -1) {
          return extraout_EAX;
        }
        setup_epoll_cold_1();
        ev.events = 1;
        argv = (char **)0x1;
        iVar7 = epollfd;
        ev.data.fd = iVar1;
        iVar1 = epoll_ctl(epollfd,1,iVar1,(epoll_event *)&ev);
        if (iVar1 != -1) {
          return extraout_EAX_00;
        }
        add_fd_to_epoll_cold_1();
        setup_signals(iVar7,argv);
        setup_epoll();
        add_fd_to_epoll(0);
        listen_sock = setup_listening_socket(5000);
        add_fd_to_epoll(listen_sock);
        nfds = epoll_wait(epollfd,(epoll_event *)events,10,-1);
        do {
          if (nfds == -1) {
            pcVar8 = "epoll_wait()";
LAB_001016a1:
            perror(pcVar8);
            exit(1);
          }
          if (0 < nfds) {
            peVar6 = &events[0].data;
            lVar5 = 0;
            do {
              iVar1 = peVar6->fd;
              if (iVar1 == 0) {
                puts("stdin ready..");
                iVar1 = 0;
                iVar7 = 1;
LAB_00101621:
                copy_fd(iVar1,iVar7);
              }
              else {
                if (iVar1 == conn_sock) {
                  puts("socket data ready..");
                  iVar1 = conn_sock;
                  iVar7 = conn_sock;
                  goto LAB_00101621;
                }
                if (iVar1 == listen_sock) {
                  puts("new connection ready..");
                  conn_sock = accept(listen_sock,(sockaddr *)0x0,(socklen_t *)0x0);
                  if (conn_sock == -1) {
                    pcVar8 = "accept()";
                    goto LAB_001016a1;
                  }
                  add_fd_to_epoll(conn_sock);
                }
              }
              lVar5 = lVar5 + 1;
              peVar6 = (epoll_data_t *)(&peVar6->fd + 3);
            } while (lVar5 < nfds);
          }
          nfds = epoll_wait(epollfd,(epoll_event *)events,10,-1);
        } while( true );
      }
LAB_001014e8:
      iVar1 = puts("No alarm set. Will not be interrupted.");
      return iVar1;
    }
    pcStack_458 = (code *)0x10142e;
    __n = strlen(acStack_450);
    pcStack_458 = (code *)0x10143b;
    sVar3 = write((int)__addr,acStack_450,__n);
    iVar1 = (int)sVar3;
  }
  return iVar1;
}

Assistant:

int setup_listening_socket(int port) {
    int sock;
    struct sockaddr_in srv_addr;

    sock = socket(PF_INET, SOCK_STREAM, 0);
    if (sock == -1)
        handle_error("socket()");

    int enable = 1;
    if (setsockopt(sock,
                   SOL_SOCKET, SO_REUSEADDR,
                   &enable, sizeof(int)) < 0)
        handle_error("setsockopt(SO_REUSEADDR)");


    memset(&srv_addr, 0, sizeof(srv_addr));
    srv_addr.sin_family = AF_INET;
    srv_addr.sin_port = htons(port);
    srv_addr.sin_addr.s_addr = htonl(INADDR_ANY);

    /* We bind to a port and turn this socket into a listening
     * socket.
     * */
    if (bind(sock,
             (const struct sockaddr *)&srv_addr,
             sizeof(srv_addr)) < 0)
        handle_error("bind()");

    if (listen(sock, 10) < 0)
        handle_error("listen()");

    return (sock);
}